

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(void)

{
  string sStack_128;
  string local_108;
  string filename;
  YAJLImage image;
  bitio_stream bstream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"/home/supercmmetry/Pictures/supercmmetry.jpg",
             (allocator<char> *)&bstream);
  std::__cxx11::string::string((string *)&local_108,&filename);
  bitio::bitio_stream::bitio_stream(&bstream,&local_108,READ,0x400);
  std::__cxx11::string::~string((string *)&local_108);
  YAJLImage::YAJLImage(&image,false);
  std::__cxx11::string::string((string *)&sStack_128,&filename);
  YAJLImage::set_src(&image,&sStack_128);
  std::__cxx11::string::~string((string *)&sStack_128);
  YAJLImage::scan_markers(&image);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  YAJLImageDescriptor::~YAJLImageDescriptor(&image.super_YAJLImageDescriptor);
  std::__cxx11::string::~string((string *)&bstream.filename);
  std::__cxx11::string::~string((string *)&filename);
  return 0;
}

Assistant:

int main() {
    std::string filename = "/home/supercmmetry/Pictures/supercmmetry.jpg";
    bitio::bitio_stream bstream(filename, bitio::READ);

    YAJLImage image(false);
    image.set_src(filename);
    image.scan_markers();
    std::cout << std::endl;
    return 0;
}